

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

void __thiscall Darts::Details::BitVector::build(BitVector *this)

{
  ulong uVar1;
  uint *puVar2;
  size_t sVar3;
  char *pcVar4;
  uint *temp;
  uint *puVar5;
  size_t sVar6;
  uint uVar7;
  size_t sVar8;
  
  uVar1 = (this->units_).size_;
  puVar5 = (uint *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 << 2);
  puVar2 = (this->ranks_).array_;
  (this->ranks_).array_ = puVar5;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
  }
  this->num_ones_ = 0;
  sVar3 = (this->units_).size_;
  if (sVar3 != 0) {
    sVar8 = this->num_ones_;
    pcVar4 = (this->units_).buf_.array_;
    puVar2 = (this->ranks_).array_;
    sVar6 = 0;
    do {
      puVar2[sVar6] = (uint)sVar8;
      uVar7 = *(uint *)(pcVar4 + sVar6 * 4);
      uVar7 = (uVar7 & 0x55555555) + (uVar7 >> 1 & 0x55555555);
      uVar7 = (uVar7 & 0x33333333) + (uVar7 >> 2 & 0x33333333);
      uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f;
      uVar7 = (uVar7 >> 8) + uVar7;
      sVar8 = ((uVar7 >> 0x10) + uVar7 & 0xff) + sVar8;
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
    this->num_ones_ = sVar8;
  }
  return;
}

Assistant:

inline void BitVector::build() {
  try {
    ranks_.reset(new id_type[units_.size()]);
  } catch (const std::bad_alloc &) {
    DARTS_THROW("failed to build rank index: std::bad_alloc");
  }

  num_ones_ = 0;
  for (std::size_t i = 0; i < units_.size(); ++i) {
    ranks_[i] = num_ones_;
    num_ones_ += pop_count(units_[i]);
  }
}